

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

string_t __thiscall
duckdb::FSSTVector::AddCompressedString(FSSTVector *this,Vector *vector,string_t data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char *data_00;
  string_t sVar4;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  char *pcVar3;
  
  pcVar3 = data.value._0_8_;
  if (0xc < (uint)vector) {
    if (*(long *)(this + 0x58) == 0) {
      make_buffer<duckdb::VectorFSSTStringBuffer>();
      p_Var2 = p_Stack_30;
      uVar1 = local_38;
      local_38 = (Vector *)0x0;
      p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
      *(undefined8 *)(this + 0x58) = uVar1;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60) = p_Var2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
      }
    }
    data_00 = pcVar3;
    if (((ulong)vector & 0xffffffff) < 0xd) {
      data_00 = (char *)((long)&local_38 + 4);
    }
    local_38 = vector;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar3;
    sVar4 = StringHeap::AddBlob((StringHeap *)(*(long *)(this + 0x58) + 0x30),data_00,
                                (ulong)vector & 0xffffffff);
    pcVar3 = sVar4.value._8_8_;
    vector = sVar4.value._0_8_;
  }
  sVar4.value.pointer.ptr = pcVar3;
  sVar4.value._0_8_ = vector;
  return (string_t)sVar4.value;
}

Assistant:

string_t FSSTVector::AddCompressedString(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorFSSTStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::FSST_BUFFER);
	auto &fsst_string_buffer = vector.auxiliary.get()->Cast<VectorFSSTStringBuffer>();
	return fsst_string_buffer.AddBlob(data);
}